

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::builtins::DynArrayDeleteMethod::eval
          (ConstantValue *__return_storage_ptr__,DynArrayDeleteMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  LValue lval;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_1c8;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1a0;
  
  Expression::evalLValue((LValue *)&local_1a0,*args->_M_ptr,context);
  if (local_1a0._M_index != '\0') {
    Type::getDefaultValue((ConstantValue *)&_Stack_1c8,((*args->_M_ptr)->type).ptr);
    LValue::store((LValue *)&local_1a0,(ConstantValue *)&_Stack_1c8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&_Stack_1c8);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        lval.store(args[0]->type->getDefaultValue());
        return nullptr;
    }